

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFactoryTest_test_setting_fx_fwd_stream_missing_LP_Test::
~SubjectFactoryTest_test_setting_fx_fwd_stream_missing_LP_Test
          (SubjectFactoryTest_test_setting_fx_fwd_stream_missing_LP_Test *this)

{
  SubjectFactoryTest_test_setting_fx_fwd_stream_missing_LP_Test *this_local;
  
  ~SubjectFactoryTest_test_setting_fx_fwd_stream_missing_LP_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_fx_fwd_stream_missing_LP)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    try
    {
        subject_factory.Fx().Stream().Forward()
                .CurrencyPair("EURGBP")
                .Currency("EUR")
                .Quantity(3500000)
                .SettlementDate(new Date(2019, 9, 18))
                .Tenor(Tenor::IN_1_YEAR)
                .CreateSubject()
                .ToString().c_str();
    }
    catch (InvalidSubjectException& e)
    {
        ASSERT_STREQ(e.what(), "subject is incomplete, missing: LiquidityProvider");
        return;
    }

    FAIL();
}